

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

VariableData *
AddFunctionUpvalue(ExpressionContext *ctx,SynBase *source,FunctionData *function,VariableData *data)

{
  uint uVar1;
  TypeBase *pTVar2;
  _func_int **pp_Var3;
  SynBase *source_00;
  bool bVar4;
  uint uVar5;
  int iVar6;
  UpvalueData **ppUVar7;
  TypeRef *pTVar8;
  VariableData *pVVar9;
  undefined4 extraout_var;
  VariableData *pVVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IntrusiveList<MemberHandle> *this;
  InplaceStr suffix;
  InplaceStr suffix_00;
  InplaceStr IVar12;
  VariableData *data_local;
  uint local_64;
  SynBase *local_60;
  VariableData *local_58;
  ScopeData *local_50;
  SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *local_48;
  SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U> *local_40;
  UpvalueData *upvalue;
  MemberHandle *pMVar10;
  
  data_local = data;
  local_60 = source;
  ppUVar7 = SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::find
                      (&function->upvalueVariableMap,&data_local);
  if (ppUVar7 == (UpvalueData **)0x0) {
    pTVar2 = function->contextType;
    if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0xff7,
                    "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
                   );
    }
    pp_Var3 = pTVar2[1]._vptr_TypeBase;
    if ((pp_Var3 == (_func_int **)0x0) || (*(int *)(pp_Var3 + 1) != 0x18)) {
      __assert_fail("classType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0xffb,
                    "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
                   );
    }
    local_50 = ctx->scope;
    ctx->scope = (ScopeData *)pp_Var3[0xc];
    local_48 = &function->upvalueNameSet;
    local_40 = &function->upvalueVariableMap;
    bVar4 = SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
                      (local_48,&data_local->name->name);
    uVar5 = 0;
    if (bVar4) {
      uVar5 = IntrusiveList<MemberHandle>::size((IntrusiveList<MemberHandle> *)(pp_Var3 + 0xd));
    }
    local_64 = uVar5;
    pTVar8 = ExpressionContext::GetReferenceType(ctx,data_local->type);
    IVar12.end = "";
    IVar12.begin = "target";
    IVar12 = GetFunctionContextMemberName(ctx,data_local->name->name,IVar12,uVar5);
    source_00 = local_60;
    uVar5 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar5 + 1;
    pVVar9 = anon_unknown.dwarf_b837c::AllocateClassMember
                       (ctx,local_60,0,&pTVar8->super_TypeBase,IVar12,SUB41(uVar5,0),
                        (uint)data_local);
    this = (IntrusiveList<MemberHandle> *)(pp_Var3 + 0xd);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var,iVar6);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar9;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    suffix.end = "";
    suffix.begin = "nextUpvalue";
    IVar12 = GetFunctionContextMemberName(ctx,data_local->name->name,suffix,local_64);
    uVar5 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar5 + 1;
    pVVar11 = anon_unknown.dwarf_b837c::AllocateClassMember
                        (ctx,source_00,0,&pTVar8->super_TypeBase,IVar12,SUB41(uVar5,0),
                         (uint)data_local);
    local_58 = pVVar11;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var_00,iVar6);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar11;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    uVar5 = data_local->alignment;
    pTVar2 = data_local->type;
    suffix_00.end = "";
    suffix_00.begin = "copy";
    IVar12 = GetFunctionContextMemberName(ctx,data_local->name->name,suffix_00,local_64);
    uVar1 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar1 + 1;
    pVVar11 = anon_unknown.dwarf_b837c::AllocateClassMember
                        (ctx,local_60,uVar5,pTVar2,IVar12,SUB41(uVar1,0),(uint)data_local);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var_01,iVar6);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar11;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    ctx->scope = local_50;
    data_local->usedAsExternal = true;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    upvalue = (UpvalueData *)CONCAT44(extraout_var_02,iVar6);
    upvalue->variable = data_local;
    upvalue->target = pVVar9;
    upvalue->nextUpvalue = local_58;
    upvalue->copy = pVVar11;
    upvalue->next = (UpvalueData *)0x0;
    upvalue->listed = false;
    IntrusiveList<UpvalueData>::push_back(&function->upvalues,upvalue);
    SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::insert
              (local_40,&data_local,&upvalue);
    SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::insert(local_48,&data_local->name->name);
  }
  else {
    pVVar9 = (*ppUVar7)->target;
  }
  return pVVar9;
}

Assistant:

VariableData* AddFunctionUpvalue(ExpressionContext &ctx, SynBase *source, FunctionData *function, VariableData *data)
{
	if(UpvalueData **prev = function->upvalueVariableMap.find(data))
		return (*prev)->target;

	TypeRef *refType = getType<TypeRef>(function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	ScopeData *currScope = ctx.scope;

	ctx.scope = classType->typeScope;

	unsigned index = 0;

	if(function->upvalueNameSet.contains(data->name->name))
		index = classType->members.size();

	// Pointer to target variable
	VariableData *target = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(data->type), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("target"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, target, NULL));

	// Pointer to next upvalue
	VariableData *nextUpvalue = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(ctx.typeVoid), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("nextUpvalue"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, nextUpvalue, NULL));

	// Copy of the data
	VariableData *copy = AllocateClassMember(ctx, source, data->alignment, data->type, GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("copy"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, copy, NULL));

	ctx.scope = currScope;

	data->usedAsExternal = true;

	UpvalueData *upvalue = new (ctx.get<UpvalueData>()) UpvalueData(data, target, nextUpvalue, copy);

	function->upvalues.push_back(upvalue);

	function->upvalueVariableMap.insert(data, upvalue);
	function->upvalueNameSet.insert(data->name->name);

	return target;
}